

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::toString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,TypeCategory category)

{
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  TypeCategory local_1c;
  VulkanHppGenerator *pVStack_18;
  TypeCategory category_local;
  VulkanHppGenerator *this_local;
  
  local_1c = category;
  pVStack_18 = this;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  switch(category) {
  case Bitmask:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bitmask",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case BaseType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"basetype",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x41f1,"std::string VulkanHppGenerator::toString(TypeCategory)");
  case Define:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"define",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case Enum:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"enum",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case ExternalType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ExternalType",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case FuncPointer:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"funcpointer",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case Handle:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"handle",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case Struct:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"struct",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case Union:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"union",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case Unknown:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unkown",&local_35);
    std::allocator<char>::~allocator(&local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::toString( TypeCategory category )
{
  switch ( category )
  {
    case TypeCategory::Bitmask     : return "bitmask";
    case TypeCategory::BaseType    : return "basetype";
    case TypeCategory::Define      : return "define";
    case TypeCategory::Enum        : return "enum";
    case TypeCategory::ExternalType: return "ExternalType";
    case TypeCategory::FuncPointer : return "funcpointer";
    case TypeCategory::Handle      : return "handle";
    case TypeCategory::Struct      : return "struct";
    case TypeCategory::Union       : return "union";
    case TypeCategory::Unknown     : return "unkown";
    default                        : assert( false ); return "";
  }
}